

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

void enet_peer_remove_incoming_commands
               (ENetList *queue,ENetListIterator startCommand,ENetListIterator endCommand,
               ENetIncomingCommand *excludeCommand)

{
  _ENetListNode **pp_Var1;
  _ENetListNode *p_Var2;
  _ENetListNode *p_Var3;
  ENetListIterator currentCommand;
  ENetIncomingCommand *incomingCommand;
  
  if (&queue->sentinel != startCommand) {
    do {
      p_Var2 = (queue->sentinel).next;
      if (&queue->sentinel != endCommand) {
        p_Var3 = (queue->sentinel).previous;
        p_Var3->next = p_Var2;
        p_Var2->previous = p_Var3;
        p_Var3 = (&queue->sentinel)[5].previous;
        if (p_Var3 != (_ENetListNode *)0x0) {
          pp_Var1 = &p_Var3[1].previous;
          *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
          if (*(int *)pp_Var1 == 0) {
            if (p_Var3[1].next != (_ENetListNode *)0x0) {
              (*(code *)p_Var3[1].next)(p_Var3);
            }
            (*(code *)callbacks_1)(p_Var3);
          }
        }
        if ((&queue->sentinel)[5].next != (_ENetListNode *)0x0) {
          (*(code *)callbacks_1)();
        }
        (*(code *)callbacks_1)(queue);
      }
      queue = (ENetList *)p_Var2;
    } while (p_Var2 != startCommand);
  }
  return;
}

Assistant:

static void enet_peer_remove_incoming_commands(ENetList* queue, ENetListIterator startCommand, ENetListIterator endCommand, ENetIncomingCommand* excludeCommand) {
	ENetListIterator currentCommand;

	for (currentCommand = startCommand; currentCommand != endCommand;) {
		ENetIncomingCommand* incomingCommand = (ENetIncomingCommand*)currentCommand;
		currentCommand = enet_list_next(currentCommand);

		if (incomingCommand == excludeCommand)
			continue;

		enet_list_remove(&incomingCommand->incomingCommandList);

		if (incomingCommand->packet != NULL) {
			--incomingCommand->packet->referenceCount;

			if (incomingCommand->packet->referenceCount == 0)
				enet_packet_destroy(incomingCommand->packet);
		}

		if (incomingCommand->fragments != NULL)
			enet_free(incomingCommand->fragments);

		enet_free(incomingCommand);
	}
}